

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_synthesis.cpp
# Opt level: O0

QueryPlan * compileQuery_NonComputeAll(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScanOperator *pSVar1;
  ColValCondDAGNode *this;
  SelectVectorizationOnlyNonBranchingOperator *this_00;
  ProjectJitNonComputeAllOperator *this_01;
  QueryPlan *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  ProjectJitNonComputeAllOperator *proj_op;
  vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> local_148;
  SelectVectorizationOnlyNonBranchingOperator *local_130;
  SelectVectorizationOnlyNonBranchingOperator *sel_op;
  string local_120;
  ColValCondDAGNode *local_100;
  undefined1 auStack_f8 [8];
  vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> expr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  ScanOperator *local_b8;
  ScanOperator *scan_op;
  allocator<char> local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70 [32];
  string local_50 [32];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  col_names;
  
  scan_op._1_1_ = 1;
  local_98 = &local_90;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"extprice",&local_99);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"discount",(allocator<char> *)((long)&scan_op + 3));
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"tax",(allocator<char> *)((long)&scan_op + 2));
  scan_op._1_1_ = 0;
  local_30 = &local_90;
  local_28 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&scan_op);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_20,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&scan_op);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&scan_op);
  local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30;
  do {
    local_198 = local_198 + -1;
    std::__cxx11::string::~string((string *)local_198);
  } while (local_198 != &local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&scan_op + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&scan_op + 3));
  std::allocator<char>::~allocator(&local_99);
  pSVar1 = (ScanOperator *)operator_new(0x30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_20);
  ScanOperator::ScanOperator(pSVar1,100000,&local_d0,true,100);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  auStack_f8 = (undefined1  [8])0x0;
  expr.super__Vector_base<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  expr.super__Vector_base<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = pSVar1;
  std::vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::vector
            ((vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)auStack_f8);
  this = (ColValCondDAGNode *)operator_new(0x48);
  sel_op._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"tax",(allocator<char> *)((long)&sel_op + 7));
  ColValCondDAGNode::ColValCondDAGNode(this,1,&local_120,0x5a);
  sel_op._6_1_ = 0;
  local_100 = this;
  std::vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::push_back
            ((vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)auStack_f8,
             (value_type *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&sel_op + 7));
  this_00 = (SelectVectorizationOnlyNonBranchingOperator *)operator_new(0x28);
  pSVar1 = local_b8;
  std::vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::vector
            (&local_148,(vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)auStack_f8);
  SelectVectorizationOnlyNonBranchingOperator::SelectVectorizationOnlyNonBranchingOperator
            (this_00,&pSVar1->super_BaseOperator,&local_148);
  std::vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::~vector(&local_148);
  local_130 = this_00;
  this_01 = (ProjectJitNonComputeAllOperator *)operator_new(0x10);
  ProjectJitNonComputeAllOperator::ProjectJitNonComputeAllOperator
            (this_01,&local_130->super_BaseOperator);
  this_02 = (QueryPlan *)operator_new(0x10);
  QueryPlan::QueryPlan(this_02,(BaseOperator *)this_01,false);
  std::vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_>::~vector
            ((vector<CondDAGNode_*,_std::allocator<CondDAGNode_*>_> *)auStack_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_20);
  return this_02;
}

Assistant:

QueryPlan *compileQuery_NonComputeAll() {
    std::vector<std::string> col_names{"extprice", "discount", "tax"};
    ScanOperator *scan_op = new ScanOperator(BATCHES, col_names, true, 100);
    std::vector<CondDAGNode*> expr{};
    expr.push_back(new ColValCondDAGNode(COND_LT, "tax", 90));

    auto sel_op = new SelectVectorizationOnlyNonBranchingOperator(scan_op, expr);
    auto proj_op = new ProjectJitNonComputeAllOperator(sel_op);
    return new QueryPlan(proj_op, false);
}